

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool crunch::progress_callback_func(uint32 percentage_complete,void *pUser_data_ptr)

{
  uint32 i;
  long lVar1;
  int iVar2;
  undefined4 in_register_0000003c;
  console *this;
  uint32 i_1;
  bool bVar3;
  char buf [8];
  
  crnlib::console::disable_crlf((console *)CONCAT44(in_register_0000003c,percentage_complete));
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    buf[lVar1] = '\b';
  }
  buf[7] = '\0';
  iVar2 = 0x10;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    crnlib::console::progress(buf);
  }
  crnlib::console::progress("Processing: %u%%",percentage_complete);
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    buf[lVar1] = ' ';
  }
  crnlib::console::progress(buf);
  crnlib::console::progress(buf);
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    buf[lVar1] = '\b';
  }
  this = (console *)buf;
  crnlib::console::progress((char *)this);
  crnlib::console::progress((char *)this);
  crnlib::console::enable_crlf(this);
  return true;
}

Assistant:

static bool progress_callback_func(uint32 percentage_complete, void* pUser_data_ptr)
    {
        pUser_data_ptr;

        console::disable_crlf();

        char buf[8];
        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = 8;
        }
        buf[7] = '\0';

        for (uint32 i = 0; i < 130 / 8; i++)
        {
            console::progress(buf);
        }

        console::progress("Processing: %u%%", percentage_complete);

        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = ' ';
        }
        console::progress(buf);
        console::progress(buf);

        for (uint32 i = 0; i < 7; i++)
        {
            buf[i] = 8;
        }
        console::progress(buf);
        console::progress(buf);

        console::enable_crlf();

        return true;
    }